

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::astc_encode_trits(uint32_t *pOutput,uint8_t *pValues,int *bit_pos,int n)

{
  uint bits_00;
  byte in_CL;
  uint32_t *in_RDX;
  long in_RSI;
  int *in_RDI;
  int T;
  int t;
  int i;
  uint32_t bit_mask;
  int bits [5];
  int trits;
  uint32_t in_stack_ffffffffffffff80;
  int local_40;
  uint32_t local_38 [6];
  int local_20;
  
  local_20 = 0;
  for (local_40 = 0; local_40 < 5; local_40 = local_40 + 1) {
    local_20 = ((int)(uint)*(byte *)(in_RSI + local_40) >> (in_CL & 0x1f)) *
               astc_encode_trits::s_muls[local_40] + local_20;
    local_38[local_40] = (uint)*(byte *)(in_RSI + local_40) & (1 << (in_CL & 0x1f)) - 1U;
  }
  if (local_20 < 0xf3) {
    bits_00 = (uint)(byte)g_astc_trit_encode[local_20];
    astc_extract_bits(bits_00,0,1);
    astc_set_bits(in_RDX,in_RDI,local_38[0],in_stack_ffffffffffffff80);
    astc_extract_bits(bits_00,2,3);
    astc_extract_bits(bits_00,4,4);
    astc_extract_bits(bits_00,5,6);
    astc_extract_bits(bits_00,7,7);
    astc_set_bits(in_RDX,in_RDI,local_38[0],in_stack_ffffffffffffff80);
    return;
  }
  __assert_fail("trits < 243",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                ,0x13fd,"void basist::astc_encode_trits(uint32_t *, const uint8_t *, int &, int)");
}

Assistant:

static void astc_encode_trits(uint32_t* pOutput, const uint8_t* pValues, int& bit_pos, int n)
	{
		// First extract the trits and the bits from the 5 input values
		int trits = 0, bits[5];
		const uint32_t bit_mask = (1 << n) - 1;
		for (int i = 0; i < 5; i++)
		{
			static const int s_muls[5] = { 1, 3, 9, 27, 81 };

			const int t = pValues[i] >> n;

			trits += t * s_muls[i];
			bits[i] = pValues[i] & bit_mask;
		}

		// Encode the trits, by inverting the bit manipulations done by the decoder, converting 5 trits into 8-bits.
		// See https://www.khronos.org/registry/DataFormat/specs/1.2/dataformat.1.2.html#astc-integer-sequence-encoding

		assert(trits < 243);
		const int T = g_astc_trit_encode[trits];

		// Now interleave the 8 encoded trit bits with the bits to form the encoded output. See table 94.
		astc_set_bits(pOutput, bit_pos, bits[0] | (astc_extract_bits(T, 0, 1) << n) | (bits[1] << (2 + n)), n * 2 + 2);

		astc_set_bits(pOutput, bit_pos, astc_extract_bits(T, 2, 3) | (bits[2] << 2) | (astc_extract_bits(T, 4, 4) << (2 + n)) | (bits[3] << (3 + n)) | (astc_extract_bits(T, 5, 6) << (3 + n * 2)) |
			(bits[4] << (5 + n * 2)) | (astc_extract_bits(T, 7, 7) << (5 + n * 3)), n * 3 + 6);
	}